

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  byte bVar2;
  sqlite3_vfs *psVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *pcVar9;
  void *pvVar10;
  _func_void *p_Var11;
  byte *pbVar12;
  char *zBuf;
  void **__dest;
  uint uVar13;
  ulong uVar14;
  char *local_58;
  void *local_40;
  undefined8 local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar3 = db->pVfs;
  local_40 = (void *)0x0;
  iVar6 = sqlite3Strlen30(zFile);
  iVar8 = 1;
  if (pzErrMsg == (char **)0x0) {
    if ((db->flags & 0x200000) == 0) goto LAB_0013c2be;
  }
  else {
    *pzErrMsg = (char *)0x0;
    if ((db->flags & 0x200000) == 0) {
      pcVar9 = sqlite3_mprintf("not authorized");
      iVar8 = 1;
      *pzErrMsg = pcVar9;
      goto LAB_0013c2be;
    }
  }
  iVar8 = iVar6 + 300;
  local_58 = "sqlite3_extension_init";
  if (zProc != (char *)0x0) {
    local_58 = zProc;
  }
  local_38 = CONCAT44(extraout_var,iVar6);
  pvVar10 = (*psVar3->xDlOpen)(psVar3,zFile);
  bVar5 = true;
  while ((bVar5 && (pvVar10 == (void *)0x0))) {
    pcVar9 = sqlite3_mprintf("%s.%s",zFile,"so");
    if (pcVar9 == (char *)0x0) {
      iVar8 = 7;
      goto LAB_0013c2be;
    }
    pvVar10 = (*psVar3->xDlOpen)(psVar3,pcVar9);
    sqlite3_free(pcVar9);
    bVar5 = false;
  }
  if (pvVar10 == (void *)0x0) {
    if (pzErrMsg != (char **)0x0) {
      pcVar9 = (char *)sqlite3_malloc(iVar8);
      *pzErrMsg = pcVar9;
      if (pcVar9 != (char *)0x0) {
        sqlite3_snprintf(iVar8,pcVar9,"unable to open shared library [%s]",zFile);
        (*psVar3->xDlError)(psVar3,(int)local_38 + 299,pcVar9);
      }
    }
  }
  else {
    p_Var11 = (*psVar3->xDlSym)(psVar3,pvVar10,local_58);
    if (zProc == (char *)0x0 && p_Var11 == (_func_void *)0x0) {
      uVar7 = sqlite3Strlen30(zFile);
      pcVar9 = (char *)sqlite3_malloc(uVar7 + 0x1e);
      if (pcVar9 == (char *)0x0) {
        (*psVar3->xDlClose)(psVar3,pvVar10);
        iVar8 = 7;
        goto LAB_0013c2be;
      }
      builtin_strncpy(pcVar9,"sqlite3_",8);
      uVar14 = (ulong)uVar7;
      do {
        if ((long)uVar14 < 1) {
          uVar7 = 0;
          goto LAB_0013c157;
        }
        uVar1 = uVar14 - 1;
        lVar4 = uVar14 - 1;
        uVar14 = uVar1;
      } while (zFile[lVar4] != '/');
      uVar7 = (int)uVar1 + 1;
LAB_0013c157:
      iVar6 = sqlite3_strnicmp(zFile + uVar7,"lib",3);
      uVar13 = uVar7 + 3;
      if (iVar6 != 0) {
        uVar13 = uVar7;
      }
      pbVar12 = (byte *)(zFile + (int)uVar13);
      iVar6 = 8;
      while( true ) {
        bVar2 = *pbVar12;
        if ((bVar2 == 0) || (bVar2 == 0x2e)) break;
        if ((""[bVar2] & 2) != 0) {
          pcVar9[iVar6] = ""[(uint)(int)(char)bVar2];
          iVar6 = iVar6 + 1;
        }
        pbVar12 = pbVar12 + 1;
      }
      (pcVar9 + (long)iVar6 + 4)[0] = 't';
      (pcVar9 + (long)iVar6 + 4)[1] = '\0';
      builtin_strncpy(pcVar9 + iVar6,"_ini",4);
      p_Var11 = (*psVar3->xDlSym)(psVar3,pvVar10,pcVar9);
      local_58 = pcVar9;
    }
    else {
      pcVar9 = (char *)0x0;
    }
    if (p_Var11 == (_func_void *)0x0) {
      if (pzErrMsg != (char **)0x0) {
        iVar6 = sqlite3Strlen30(local_58);
        iVar6 = iVar6 + iVar8;
        zBuf = (char *)sqlite3_malloc(iVar6);
        *pzErrMsg = zBuf;
        if (zBuf != (char *)0x0) {
          sqlite3_snprintf(iVar6,zBuf,"no entry point [%s] in shared library [%s]",local_58,zFile);
          (*psVar3->xDlError)(psVar3,iVar6 + -1,zBuf);
        }
      }
      (*psVar3->xDlClose)(psVar3,pvVar10);
      sqlite3_free(pcVar9);
    }
    else {
      sqlite3_free(pcVar9);
      iVar8 = (*p_Var11)(db,&local_40,&sqlite3Apis);
      if (iVar8 == 0) {
        __dest = (void **)sqlite3DbMallocZero(db,db->nExtension * 8 + 8);
        iVar8 = 7;
        if (__dest != (void **)0x0) {
          if (0 < (long)db->nExtension) {
            memcpy(__dest,db->aExtension,(long)db->nExtension << 3);
          }
          sqlite3DbFree(db,db->aExtension);
          db->aExtension = __dest;
          iVar8 = db->nExtension;
          db->nExtension = iVar8 + 1;
          __dest[iVar8] = pvVar10;
          iVar8 = 0;
        }
        goto LAB_0013c2be;
      }
      if (pzErrMsg != (char **)0x0) {
        pcVar9 = sqlite3_mprintf("error during initialization: %s",local_40);
        *pzErrMsg = pcVar9;
      }
      sqlite3_free(local_40);
      (*psVar3->xDlClose)(psVar3,pvVar10);
    }
  }
  iVar8 = 1;
LAB_0013c2be:
  iVar8 = sqlite3ApiExit(db,iVar8);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar8;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}